

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

_Bool rlEnableVertexArray(uint vaoId)

{
  _Bool _Var1;
  _Bool result;
  uint vaoId_local;
  
  _Var1 = RLGL.ExtSupported.vao;
  if (RLGL.ExtSupported.vao) {
    (*glad_glBindVertexArray)(vaoId);
  }
  return _Var1;
}

Assistant:

bool rlEnableVertexArray(unsigned int vaoId)
{
    bool result = false;
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    if (RLGL.ExtSupported.vao)
    {
        glBindVertexArray(vaoId);
        result = true;
    }
#endif
    return result;
}